

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gi.c
# Opt level: O3

void golf_gi_start(golf_gi_t *gi)

{
  golf_mutex_t *mutex;
  _Bool _Var1;
  golf_thread_t pvVar2;
  
  mutex = &gi->lock;
  golf_mutex_lock(mutex);
  _Var1 = gi->is_running;
  golf_mutex_unlock(mutex);
  if (_Var1 == true) {
    golf_log_error("Cannot start gi when it\'s already running.");
  }
  golf_mutex_lock(mutex);
  gi->is_running = true;
  golf_mutex_unlock(mutex);
  pvVar2 = golf_thread_create(_gi_run,gi,"gi");
  gi->thread = pvVar2;
  return;
}

Assistant:

void golf_gi_start(golf_gi_t *gi) {
    if (golf_gi_is_running(gi)) {
        golf_log_error("Cannot start gi when it's already running.");
    }

    _gi_set_is_running(gi, true);
    gi->thread = golf_thread_create(_gi_run, gi, "gi");
}